

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

int If_CluDetectSpecialCaseCofs(word *pF,int nVars,int iVar)

{
  int iVar1;
  ulong uVar2;
  int local_58;
  int Step;
  int k;
  int Shift;
  int nWords;
  int i;
  int State [6];
  word Cof1;
  word Cof0;
  int iVar_local;
  int nVars_local;
  word *pF_local;
  
  memset(&nWords,0,0x18);
  k = If_CluWordNum(nVars);
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifDec16.c"
                  ,0x41b,"int If_CluDetectSpecialCaseCofs(word *, int, int)");
  }
  if (iVar < 6) {
    for (Shift = 0; Shift < k; Shift = Shift + 1) {
      uVar2 = pF[Shift] & (Truth6[iVar] ^ 0xffffffffffffffff);
      State._16_8_ = (pF[Shift] & Truth6[iVar]) >> ((byte)(1 << ((byte)iVar & 0x1f)) & 0x3f);
      if (uVar2 == 0) {
        nWords = nWords + 1;
      }
      else if (uVar2 == (Truth6[iVar] ^ 0xffffffffffffffff)) {
        i = i + 1;
      }
      else if (State._16_8_ == 0) {
        State[0] = State[0] + 1;
      }
      else if (State._16_8_ == (Truth6[iVar] ^ 0xffffffffffffffff)) {
        State[1] = State[1] + 1;
      }
      else if (uVar2 == (State._16_8_ ^ 0xffffffffffffffff)) {
        State[2] = State[2] + 1;
      }
      else if (uVar2 == State._16_8_) {
        State[3] = State[3] + 1;
      }
    }
  }
  else {
    iVar1 = 1 << ((byte)iVar - 6 & 0x1f);
    _iVar_local = pF;
    for (local_58 = 0; local_58 < k; local_58 = iVar1 * 2 + local_58) {
      for (Shift = 0; Shift < iVar1; Shift = Shift + 1) {
        uVar2 = _iVar_local[Shift];
        State._16_8_ = _iVar_local[iVar1 + Shift];
        if (uVar2 == 0) {
          nWords = nWords + 1;
        }
        else if (uVar2 == 0xffffffffffffffff) {
          i = i + 1;
        }
        else if (State._16_8_ == 0) {
          State[0] = State[0] + 1;
        }
        else if (State._16_8_ == 0xffffffffffffffff) {
          State[1] = State[1] + 1;
        }
        else if (uVar2 == (State._16_8_ ^ 0xffffffffffffffff)) {
          State[2] = State[2] + 1;
        }
        else if (uVar2 == State._16_8_) {
          State[3] = State[3] + 1;
        }
      }
      _iVar_local = _iVar_local + (iVar1 << 1);
    }
    k = k / 2;
  }
  if (State[3] != k) {
    Shift = 0;
    while( true ) {
      if (4 < Shift) {
        return -1;
      }
      if (k < (&nWords)[Shift]) break;
      if ((&nWords)[Shift] == k) {
        return Shift;
      }
      Shift = Shift + 1;
    }
    __assert_fail("State[i] <= nWords",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifDec16.c"
                  ,0x450,"int If_CluDetectSpecialCaseCofs(word *, int, int)");
  }
  __assert_fail("State[5] != nWords",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifDec16.c"
                ,0x44d,"int If_CluDetectSpecialCaseCofs(word *, int, int)");
}

Assistant:

int If_CluDetectSpecialCaseCofs( word * pF, int nVars, int iVar )
{
    word Cof0, Cof1;
    int State[6] = {0};
    int i, nWords = If_CluWordNum( nVars );
    assert( iVar < nVars );
    if ( iVar < 6 )
    {
        int Shift = (1 << iVar);
        for ( i = 0; i < nWords; i++ )
        {
            Cof0 =  (pF[i] & ~Truth6[iVar]);
            Cof1 = ((pF[i] &  Truth6[iVar]) >> Shift);

            if ( Cof0 == 0 )
                State[0]++;
            else if ( Cof0 == ~Truth6[iVar] )
                State[1]++;
            else if ( Cof1 == 0 )
                State[2]++;
            else if ( Cof1 == ~Truth6[iVar] )
                State[3]++;
            else if ( Cof0 == ~Cof1 )
                State[4]++;
            else if ( Cof0 == Cof1 )
                State[5]++;
        }
    }
    else
    {
        int k, Step = (1 << (iVar - 6));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
            {
                Cof0 = pF[i];
                Cof1 = pF[Step+i];

                if ( Cof0 == 0 )
                    State[0]++;
                else if ( Cof0 == ~(word)0 )
                    State[1]++;
                else if ( Cof1 == 0 )
                    State[2]++;
                else if ( Cof1 == ~(word)0 )
                    State[3]++;
                else if ( Cof0 == ~Cof1 )
                    State[4]++;
                else if ( Cof0 == Cof1 )
                    State[5]++;
            }
            pF    += 2*Step;
        }
        nWords /= 2;
    }
    assert( State[5] != nWords );
    for ( i = 0; i < 5; i++ )
    {
        assert( State[i] <= nWords );
        if ( State[i] == nWords )
            return i;
    }
    return -1;
}